

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

void * nghttp2_session_get_stream_user_data(nghttp2_session *session,int32_t stream_id)

{
  nghttp2_stream *pnVar1;
  nghttp2_stream *stream;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  pnVar1 = nghttp2_session_get_stream(session,stream_id);
  if (pnVar1 == (nghttp2_stream *)0x0) {
    session_local = (nghttp2_session *)0x0;
  }
  else {
    session_local = (nghttp2_session *)pnVar1->stream_user_data;
  }
  return session_local;
}

Assistant:

void *nghttp2_session_get_stream_user_data(nghttp2_session *session,
                                           int32_t stream_id) {
  nghttp2_stream *stream;
  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream) {
    return stream->stream_user_data;
  } else {
    return NULL;
  }
}